

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O3

void __thiscall inja::Renderer::~Renderer(Renderer *this)

{
  pointer ppbVar1;
  
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant(&this->m_tmp_val);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)&(this->m_tmp_val).m_value.boolean,(this->m_tmp_val).m_type);
  ppbVar1 = (this->m_tmp_args).
            super__Vector_base<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppbVar1 != (pointer)0x0) {
    operator_delete(ppbVar1);
  }
  std::vector<inja::Renderer::LoopLevel,_std::allocator<inja::Renderer::LoopLevel>_>::~vector
            (&this->m_loop_stack);
  std::
  vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  ::~vector(&this->m_stack);
  return;
}

Assistant:

std::vector<const json*>& get_args(const Bytecode& bc) {
		m_tmp_args.clear();

		bool has_imm = ((bc.flags & Bytecode::Flag::ValueMask) != Bytecode::Flag::ValuePop);

		// get args from stack
		unsigned int pop_args = bc.args;
		if (has_imm) {
			pop_args -= 1;
		}

		for (auto i = std::prev(m_stack.end(), pop_args); i != m_stack.end(); i++) {
			m_tmp_args.push_back(&(*i));
		}

		// get immediate arg
		if (has_imm) {
			m_tmp_args.push_back(get_imm(bc));
		}

		return m_tmp_args;
	}